

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O1

void __thiscall QBalloonTip::balloon(QBalloonTip *this,QPoint *pos,int msecs,bool showArrow)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  qreal qVar6;
  QPalette *pQVar7;
  undefined8 *puVar8;
  long *plVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long in_FS_OFFSET;
  double dVar17;
  QSize QVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  QColor QVar23;
  undefined1 auVar24 [16];
  QPainter painter2;
  QPainter painter1;
  QPainterPath path;
  QSize sz;
  int local_d8;
  QBrush local_b8 [8];
  QPen local_b0 [8];
  undefined1 *local_a8 [2];
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  undefined1 *puStack_50;
  undefined1 *local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->showArrow = showArrow;
  lVar4 = QGuiApplication::screenAt(pos);
  if (lVar4 == 0) {
    QGuiApplication::primaryScreen();
  }
  auVar24 = QScreen::geometry();
  uVar5 = (**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
  iVar11 = (int)uVar5 + (pos->xp).m_i + -0x12;
  iVar10 = (pos->yp).m_i + (int)((ulong)uVar5 >> 0x20) + 0x12;
  iVar14 = (auVar24._12_4_ - auVar24._4_4_) + 1;
  iVar3 = auVar24._8_4_;
  iVar16 = auVar24._0_4_;
  iVar1 = (iVar3 - iVar16) + 1;
  iVar15 = 0x15;
  iVar12 = 3;
  if (iVar10 < iVar14) {
    iVar12 = 0x15;
    iVar15 = 3;
  }
  uVar13 = 0x12;
  if (iVar14 <= iVar10) {
    uVar13 = 0;
  }
  QWidget::setContentsMargins(&this->super_QWidget,4,iVar12,4,iVar15);
  QWidget::updateGeometry(&this->super_QWidget);
  uVar5 = (**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  qVar6 = (qreal)(**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
  local_68._12_4_ = (undefined4)((ulong)qVar6 >> 0x20);
  lVar4 = ((ulong)-(uint)(iVar10 < iVar14) | 0xffffffffffffffed) + (long)(int)local_68._12_4_;
  iVar12 = SUB84(qVar6,0);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = qVar6;
  QPainterPath::QPainterPath((QPainterPath *)local_68);
  dVar17 = (double)uVar13;
  local_58._0_4_ = 0;
  local_58._4_4_ = 0x401c0000;
  puStack_50 = (undefined1 *)dVar17;
  QPainterPath::moveTo((QPointF *)local_68);
  iVar15 = (int)uVar5;
  if ((iVar14 <= iVar10) || (iVar1 <= iVar11)) {
    if (iVar10 < iVar14 && iVar1 <= iVar11) {
      if (showArrow) {
        local_58 = (undefined1  [8])(double)(iVar12 + -0x25);
        puStack_50 = (undefined1 *)dVar17;
        QPainterPath::lineTo((QPointF *)local_68);
        puStack_50 = (undefined1 *)(double)(int)(uVar13 - 0x12);
        local_58 = (undefined1  [8])(double)(iVar12 + -0x13);
        QPainterPath::lineTo((QPointF *)local_68);
        local_58 = (undefined1  [8])(double)(iVar12 + -0x13);
        puStack_50 = (undefined1 *)dVar17;
        QPainterPath::lineTo((QPointF *)local_68);
      }
      iVar2 = ((pos->xp).m_i - iVar15) + 0x12;
      local_58._0_4_ = (iVar3 - iVar15) + -2;
      if (iVar2 < (int)local_58._0_4_) {
        local_58._0_4_ = iVar2;
      }
      local_58._4_4_ = (pos->yp).m_i;
      goto LAB_0038f7c8;
    }
  }
  else {
    if (showArrow) {
      local_58._0_4_ = 0;
      local_58._4_4_ = 0x40320000;
      puStack_50 = (undefined1 *)dVar17;
      QPainterPath::lineTo((QPointF *)local_68);
      puStack_50 = (undefined1 *)(double)(int)(uVar13 - 0x12);
      local_58._0_4_ = 0;
      local_58._4_4_ = 0x40320000;
      QPainterPath::lineTo((QPointF *)local_68);
      local_58._0_4_ = 0;
      local_58._4_4_ = 0x40420000;
      puStack_50 = (undefined1 *)dVar17;
      QPainterPath::lineTo((QPointF *)local_68);
    }
    local_58._0_4_ = (pos->xp).m_i + -0x12;
    if ((int)local_58._0_4_ <= iVar16 + 2) {
      local_58._0_4_ = iVar16 + 2;
    }
    local_58._4_4_ = (pos->yp).m_i;
LAB_0038f7c8:
    QWidget::move(&this->super_QWidget,(QPoint *)local_58);
  }
  local_58 = (undefined1  [8])(double)(iVar12 + -8);
  puStack_50 = (undefined1 *)dVar17;
  QPainterPath::lineTo((QPointF *)local_68);
  QVar18 = (QSize)(double)(int)((long)iVar12 + -0xf);
  dVar19 = (double)(((long)(iVar12 + -2) - ((long)iVar12 + -0xf)) + 1);
  dVar20 = (double)(int)(((uVar13 | 0xd) - uVar13) + 1);
  local_58 = (undefined1  [8])QVar18;
  puStack_50 = (undefined1 *)dVar17;
  local_48 = (undefined1 *)dVar19;
  local_40 = dVar20;
  QPainterPath::arcTo((QRectF *)local_68,90.0,-90.0);
  local_58 = (undefined1  [8])(double)(iVar12 + -1);
  iVar2 = (int)lVar4;
  puStack_50 = (undefined1 *)(double)(iVar2 + -7);
  QPainterPath::lineTo((QPointF *)local_68);
  lVar4 = lVar4 + -0xe;
  dVar21 = (double)(int)lVar4;
  dVar22 = (double)(((iVar2 + -1) - lVar4) + 1);
  local_58 = (undefined1  [8])QVar18;
  puStack_50 = (undefined1 *)dVar21;
  local_48 = (undefined1 *)dVar19;
  local_40 = dVar22;
  QPainterPath::arcTo((QRectF *)local_68,0.0,-90.0);
  dVar19 = (double)iVar2;
  if ((iVar10 < iVar14) || (iVar11 < iVar1)) {
    if (iVar10 < iVar14 || iVar1 <= iVar11) goto LAB_0038fb1b;
    if (showArrow) {
      local_58._0_4_ = 0;
      local_58._4_4_ = 0x40420000;
      puStack_50 = (undefined1 *)dVar19;
      QPainterPath::lineTo((QPointF *)local_68);
      puStack_50 = (undefined1 *)(double)(iVar2 + 0x12);
      local_58._0_4_ = 0;
      local_58._4_4_ = 0x40320000;
      QPainterPath::lineTo((QPointF *)local_68);
      local_58._0_4_ = 0;
      local_58._4_4_ = 0x40320000;
      puStack_50 = (undefined1 *)dVar19;
      QPainterPath::lineTo((QPointF *)local_68);
    }
    iVar12 = (pos->yp).m_i;
    iVar3 = (pos->xp).m_i + -0x12;
    local_58._0_4_ = iVar16 + 2;
    if (iVar16 + 2 < iVar3) {
      local_58._0_4_ = iVar3;
    }
  }
  else {
    if (showArrow) {
      local_58 = (undefined1  [8])(double)(iVar12 + -0x13);
      puStack_50 = (undefined1 *)dVar19;
      QPainterPath::lineTo((QPointF *)local_68);
      local_58 = (undefined1  [8])(double)(iVar12 + -0x13);
      puStack_50 = (undefined1 *)(double)(iVar2 + 0x12);
      QPainterPath::lineTo((QPointF *)local_68);
      local_58 = (undefined1  [8])(double)(iVar12 + -0x25);
      puStack_50 = (undefined1 *)dVar19;
      QPainterPath::lineTo((QPointF *)local_68);
    }
    iVar12 = (pos->yp).m_i;
    iVar1 = ((pos->xp).m_i - iVar15) + 0x12;
    local_58._0_4_ = (iVar3 - iVar15) + -2;
    if (iVar1 < (int)local_58._0_4_) {
      local_58._0_4_ = iVar1;
    }
  }
  local_d8 = (int)((ulong)uVar5 >> 0x20);
  local_58._4_4_ = iVar12 - local_d8;
  QWidget::move(&this->super_QWidget,(QPoint *)local_58);
LAB_0038fb1b:
  local_58._0_4_ = 0;
  local_58._4_4_ = 0x401c0000;
  puStack_50 = (undefined1 *)dVar19;
  QPainterPath::lineTo((QPointF *)local_68);
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  local_48 = (undefined1 *)0x402c000000000000;
  puStack_50 = (undefined1 *)dVar21;
  local_40 = dVar22;
  QPainterPath::arcTo((QRectF *)local_68,-90.0,-90.0);
  puStack_50 = (undefined1 *)(double)(uVar13 + 7);
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  QPainterPath::lineTo((QPointF *)local_68);
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  local_48 = (undefined1 *)0x402c000000000000;
  puStack_50 = (undefined1 *)dVar17;
  local_40 = dVar20;
  QPainterPath::arcTo((QRectF *)local_68,180.0,-90.0);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (undefined1  [8])(**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
  QBitmap::QBitmap((QBitmap *)local_88,(QSize *)local_58);
  QColor::QColor((QColor *)local_58,color0);
  QPixmap::fill((QColor *)local_88);
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_90,(QPaintDevice *)local_88);
  QBrush::QBrush((QBrush *)local_a8,color1,SolidPattern);
  QPen::QPen((QPen *)local_58,(QBrush *)local_a8,1.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)&local_90);
  QPen::~QPen((QPen *)local_58);
  QBrush::~QBrush((QBrush *)local_a8);
  QBrush::QBrush((QBrush *)local_58,color1,SolidPattern);
  QPainter::setBrush((QBrush *)&local_90);
  QBrush::~QBrush((QBrush *)local_58);
  QPainter::drawPath((QPainterPath *)&local_90);
  QWidget::setMask(&this->super_QWidget,(QBitmap *)local_88);
  QPixmap::QPixmap((QPixmap *)local_a8,(QSize *)(local_68 + 8));
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
  uVar5 = local_98;
  local_58 = (undefined1  [8])QDataStream::operator<<;
  local_98 = 0;
  local_48 = *(undefined1 **)&this->field_0x40;
  *(undefined8 *)&this->field_0x40 = uVar5;
  QPixmap::~QPixmap((QPixmap *)local_58);
  QPixmap::~QPixmap((QPixmap *)local_a8);
  local_a8[0] = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)local_a8,(QPaintDevice *)&this->pixmap);
  pQVar7 = QWidget::palette(&this->super_QWidget);
  puVar8 = (undefined8 *)QPalette::brush((ColorGroup)pQVar7,Dark);
  auVar24 = QColor::darker((int)*puVar8 + 8);
  local_58 = auVar24._0_8_;
  puStack_50._0_6_ = auVar24._8_6_;
  QBrush::QBrush(local_b8,(QColor *)local_58,SolidPattern);
  QPen::QPen(local_b0,local_b8,1.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)local_a8);
  QPen::~QPen(local_b0);
  QBrush::~QBrush(local_b8);
  pQVar7 = QWidget::palette(&this->super_QWidget);
  plVar9 = (long *)QPalette::brush((ColorGroup)pQVar7,Dark);
  QVar23._8_8_ = *(undefined8 *)(*plVar9 + 8);
  QVar23._0_8_ = (QPainter *)local_a8;
  QPainter::setBrush(QVar23);
  QPainter::drawPath((QPainterPath *)local_a8);
  if (0 < msecs) {
    QBasicTimer::start(&this->timer,(ulong)(uint)msecs * 1000000,1,this);
  }
  QWidget::show(&this->super_QWidget);
  QPainter::~QPainter((QPainter *)local_a8);
  QPainter::~QPainter((QPainter *)&local_90);
  QBitmap::~QBitmap((QBitmap *)local_88);
  QPainterPath::~QPainterPath((QPainterPath *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBalloonTip::balloon(const QPoint& pos, int msecs, bool showArrow)
{
    this->showArrow = showArrow;
    QScreen *screen = QGuiApplication::screenAt(pos);
    if (!screen)
        screen = QGuiApplication::primaryScreen();
    QRect screenRect = screen->geometry();
    QSize sh = sizeHint();
    const int border = 1;
    const int ah = 18, ao = 18, aw = 18, rc = 7;
    bool arrowAtTop = (pos.y() + sh.height() + ah < screenRect.height());
    bool arrowAtLeft = (pos.x() + sh.width() - ao < screenRect.width());
    setContentsMargins(border + 3,  border + (arrowAtTop ? ah : 0) + 2, border + 3, border + (arrowAtTop ? 0 : ah) + 2);
    updateGeometry();
    sh  = sizeHint();

    int ml, mr, mt, mb;
    QSize sz = sizeHint();
    if (!arrowAtTop) {
        ml = mt = 0;
        mr = sz.width() - 1;
        mb = sz.height() - ah - 1;
    } else {
        ml = 0;
        mt = ah;
        mr = sz.width() - 1;
        mb = sz.height() - 1;
    }

    QPainterPath path;
    path.moveTo(ml + rc, mt);
    if (arrowAtTop && arrowAtLeft) {
        if (showArrow) {
            path.lineTo(ml + ao, mt);
            path.lineTo(ml + ao, mt - ah);
            path.lineTo(ml + ao + aw, mt);
        }
        move(qMax(pos.x() - ao, screenRect.left() + 2), pos.y());
    } else if (arrowAtTop && !arrowAtLeft) {
        if (showArrow) {
            path.lineTo(mr - ao - aw, mt);
            path.lineTo(mr - ao, mt - ah);
            path.lineTo(mr - ao, mt);
        }
        move(qMin(pos.x() - sh.width() + ao, screenRect.right() - sh.width() - 2), pos.y());
    }
    path.lineTo(mr - rc, mt);
    path.arcTo(QRect(mr - rc*2, mt, rc*2, rc*2), 90, -90);
    path.lineTo(mr, mb - rc);
    path.arcTo(QRect(mr - rc*2, mb - rc*2, rc*2, rc*2), 0, -90);
    if (!arrowAtTop && !arrowAtLeft) {
        if (showArrow) {
            path.lineTo(mr - ao, mb);
            path.lineTo(mr - ao, mb + ah);
            path.lineTo(mr - ao - aw, mb);
        }
        move(qMin(pos.x() - sh.width() + ao, screenRect.right() - sh.width() - 2),
             pos.y() - sh.height());
    } else if (!arrowAtTop && arrowAtLeft) {
        if (showArrow) {
            path.lineTo(ao + aw, mb);
            path.lineTo(ao, mb + ah);
            path.lineTo(ao, mb);
        }
        move(qMax(pos.x() - ao, screenRect.x() + 2), pos.y() - sh.height());
    }
    path.lineTo(ml + rc, mb);
    path.arcTo(QRect(ml, mb - rc*2, rc*2, rc*2), -90, -90);
    path.lineTo(ml, mt + rc);
    path.arcTo(QRect(ml, mt, rc*2, rc*2), 180, -90);

    // Set the mask
    QBitmap bitmap = QBitmap(sizeHint());
    bitmap.fill(Qt::color0);
    QPainter painter1(&bitmap);
    painter1.setPen(QPen(Qt::color1, border));
    painter1.setBrush(QBrush(Qt::color1));
    painter1.drawPath(path);
    setMask(bitmap);

    // Draw the border
    pixmap = QPixmap(sz);
    QPainter painter2(&pixmap);
    painter2.setPen(QPen(palette().color(QPalette::Window).darker(160), border));
    painter2.setBrush(palette().color(QPalette::Window));
    painter2.drawPath(path);

    if (msecs > 0)
        timer.start(msecs * 1ms, this);
    show();
}